

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtScalar.h
# Opt level: O2

cbtVector3 __thiscall cbtVector3::absolute(cbtVector3 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  cbtVector3 cVar4;
  
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(this->m_floats + 1);
  auVar1 = vandps_avx(ZEXT416((uint)this->m_floats[0]),auVar2);
  auVar2 = vandps_avx(auVar3,auVar2);
  auVar1 = vinsertps_avx(auVar1,auVar2,0x1c);
  auVar2 = vinsertps_avx(auVar1,auVar2,0x4e);
  cVar4.m_floats._0_8_ = auVar1._0_8_;
  cVar4.m_floats._8_8_ = auVar2._0_8_;
  return (cbtVector3)cVar4.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar cbtFabs(cbtScalar x) { return fabsf(x); }